

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.cpp
# Opt level: O3

bool NULLCIO::IsToggled(int key)

{
  nullcThrowError("IsToggled: supported only under Windows");
  return false;
}

Assistant:

bool IsToggled(int key)
	{
#if defined(_MSC_VER)
		unsigned char arr[256];
		::GetKeyboardState(arr);
		return !!(arr[key & 0xff] & 0x1);
#elif defined(EMSCRIPTEN)
		static Uint8 prevState[256];

		int numKeys = 0;
		const Uint8* keys = SDL_GetKeyboardState(&numKeys);

		if(key < 256 && key < numKeys)
		{
			bool changed = prevState[key] != keys[key];

			prevState[key] = keys[key];

			return changed;
		}

		return false;
#else
		(void)key;

		nullcThrowError("IsToggled: supported only under Windows");
		return false;
#endif
	}